

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help.cpp
# Opt level: O3

categories_collection *
pstore::command_line::details::build_categories
          (categories_collection *__return_storage_ptr__,option *self,options_container *all)

{
  _Rb_tree_header *p_Var1;
  _List_node_base *p_Var2;
  option *poVar3;
  int iVar4;
  undefined4 extraout_var;
  _Rb_tree<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::gsl::not_null<pstore::command_line::option_const*>,std::_Identity<pstore::gsl::not_null<pstore::command_line::option_const*>>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>
  *this;
  not_null<const_pstore::command_line::option_*> local_40;
  key_type local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var2 = (all->
                super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                )._M_impl._M_node.super__List_node_base._M_next; p_Var2 != (_List_node_base *)all;
      p_Var2 = (((_List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    poVar3 = (option *)p_Var2[1]._M_next;
    if ((poVar3 != self) &&
       (iVar4 = (*(code *)((_List_node_base *)poVar3->_vptr_option)[4]._M_prev)(poVar3),
       (char)iVar4 == '\0')) {
      iVar4 = (*(code *)((_List_node_base *)poVar3->_vptr_option)[3]._M_prev)(poVar3);
      local_38 = (key_type)CONCAT44(extraout_var,iVar4);
      this = (_Rb_tree<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::gsl::not_null<pstore::command_line::option_const*>,std::_Identity<pstore::gsl::not_null<pstore::command_line::option_const*>>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>
              *)std::
                map<const_pstore::command_line::option_category_*,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>,_std::less<const_pstore::command_line::option_category_*>,_std::allocator<std::pair<const_pstore::command_line::option_category_*const,_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_>_>_>
                ::operator[](__return_storage_ptr__,&local_38);
      local_40.ptr_ = poVar3;
      gsl::not_null<const_pstore::command_line::option_*>::ensure_invariant(&local_40);
      std::
      _Rb_tree<pstore::gsl::not_null<pstore::command_line::option_const*>,pstore::gsl::not_null<pstore::command_line::option_const*>,std::_Identity<pstore::gsl::not_null<pstore::command_line::option_const*>>,pstore::command_line::details::less_name,std::allocator<pstore::gsl::not_null<pstore::command_line::option_const*>>>
      ::_M_insert_unique<pstore::gsl::not_null<pstore::command_line::option_const*>>(this,&local_40)
      ;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

categories_collection build_categories (option const * const self,
                                                        option::options_container const & all) {
                    categories_collection categories;
                    for (option const * const op : all) {
                        if (op != self && !op->is_positional ()) {
                            categories[op->category ()].insert (op);
                        }
                    }
                    return categories;
                }